

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_dr_prediction_z1_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  uint8_t uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  
  bVar3 = (byte)upsample_above;
  iVar7 = bw + bh + -1 << (bVar3 & 0x1f);
  lVar5 = (long)iVar7;
  iVar12 = 0;
  uVar9 = 0;
  if (0 < bw) {
    uVar9 = (ulong)(uint)bw;
  }
  iVar4 = dx;
  iVar10 = 0;
  if (0 < bh) {
    iVar10 = bh;
  }
  while( true ) {
    if (iVar12 == iVar10) {
      return;
    }
    iVar1 = iVar4 >> (6 - bVar3 & 0x1f);
    if (iVar7 <= iVar1) break;
    uVar8 = (uint)(iVar4 << (bVar3 & 0x1f)) >> 1 & 0x1f;
    lVar2 = (long)iVar1;
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      if (lVar2 < lVar5) {
        uVar6 = (uint8_t)((uint)above[lVar2] * (0x20 - uVar8) + above[lVar2 + 1] * uVar8 + 0x10 >> 5
                         );
      }
      else {
        uVar6 = above[lVar5];
      }
      dst[uVar11] = uVar6;
      lVar2 = lVar2 + (1 << (bVar3 & 0x1f));
    }
    iVar12 = iVar12 + 1;
    dst = dst + stride;
    iVar4 = iVar4 + dx;
  }
  if (bh <= iVar12) {
    bh = iVar12;
  }
  for (; iVar12 != bh; bh = bh + -1) {
    memset(dst,(uint)above[lVar5],(long)bw);
    dst = dst + stride;
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_above, int dx, int dy) {
  int r, c, x, base, shift, val;

  (void)left;
  (void)dy;
  assert(dy == 1);
  assert(dx > 0);

  const int max_base_x = ((bw + bh) - 1) << upsample_above;
  const int frac_bits = 6 - upsample_above;
  const int base_inc = 1 << upsample_above;
  x = dx;
  for (r = 0; r < bh; ++r, dst += stride, x += dx) {
    base = x >> frac_bits;
    shift = ((x << upsample_above) & 0x3F) >> 1;

    if (base >= max_base_x) {
      for (int i = r; i < bh; ++i) {
        memset(dst, above[max_base_x], bw * sizeof(dst[0]));
        dst += stride;
      }
      return;
    }

    for (c = 0; c < bw; ++c, base += base_inc) {
      if (base < max_base_x) {
        val = above[base] * (32 - shift) + above[base + 1] * shift;
        dst[c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        dst[c] = above[max_base_x];
      }
    }
  }
}